

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

void __thiscall mocker::ir::Builder::operator()(Builder *this,FuncDecl *node)

{
  ulong __val;
  element_type *peVar1;
  pointer psVar2;
  BuilderContext *pBVar3;
  pointer pcVar4;
  element_type *peVar5;
  pointer psVar6;
  element_type *peVar7;
  char cVar8;
  bool bVar9;
  BBLIter BVar10;
  pointer psVar11;
  undefined8 uVar12;
  ulong uVar13;
  char cVar14;
  long *unaff_R14;
  shared_ptr<mocker::ast::VarDeclStmt> *param;
  ulong uVar15;
  pointer psVar16;
  shared_ptr<mocker::ir::Reg> reg_1;
  shared_ptr<mocker::ir::Reg> reg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paramIdent;
  string __str;
  undefined1 local_259;
  shared_ptr<mocker::ir::Reg> local_258;
  FuncDecl *local_248;
  shared_ptr<mocker::ir::Reg> local_240;
  FunctionModule *local_230;
  shared_ptr<mocker::ir::Reg> local_228;
  undefined1 local_218 [16];
  undefined1 local_208 [32];
  long *local_1e8;
  uint local_1e0;
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  ulong local_1a8;
  shared_ptr<mocker::ir::IRInst> local_1a0;
  long *local_190 [2];
  long local_180 [2];
  long *local_170 [2];
  long local_160 [2];
  string local_150;
  shared_ptr<mocker::ir::IRInst> local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  FunctionModule local_108;
  
  peVar1 = (node->identifier).
           super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_248 = node;
  if ((peVar1->val)._M_string_length == 0) {
    uVar12 = std::__throw_out_of_range_fmt
                       ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0);
    if (local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_190[0] != unaff_R14) {
      operator_delete(local_190[0],local_180[0] + 1);
    }
    if (local_228.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_228.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208);
    _Unwind_Resume(uVar12);
  }
  cVar14 = *(peVar1->val)._M_dataplus._M_p;
  local_208._0_8_ = (pointer)0x0;
  local_208._8_8_ = (pointer)0x0;
  local_208._16_8_ = (pointer)0x0;
  if (cVar14 == '#') {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_208,
               (char (*) [5])"this");
  }
  psVar11 = (local_248->formalParameters).
            super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (local_248->formalParameters).
           super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar11 != psVar2) {
    do {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_208,
                 &((((psVar11->
                     super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->identifier).
                   super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  val);
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar2);
  }
  pBVar3 = this->ctx;
  peVar1 = (local_248->identifier).
           super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar4 = (peVar1->val)._M_dataplus._M_p;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar4,pcVar4 + (peVar1->val)._M_string_length);
  local_120.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_208._0_8_;
  local_120.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_208._8_8_;
  local_120.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_208._16_8_;
  local_208._0_8_ = (pointer)0x0;
  local_208._8_8_ = 0;
  local_208._16_8_ = 0;
  FunctionModule::FunctionModule(&local_108,&local_150,&local_120,false);
  local_230 = BuilderContext::addFunc(pBVar3,&local_108);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_108.predecessors._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_108.bbMap._M_h);
  std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
  _M_clear(&local_108.bbs.
            super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.identifier._M_dataplus._M_p != &local_108.identifier.field_2) {
    operator_delete(local_108.identifier._M_dataplus._M_p,
                    local_108.identifier.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  BuilderContext::initFuncCtx
            (this->ctx,
             (long)(local_248->formalParameters).
                   super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_248->formalParameters).
                   super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  pBVar3 = this->ctx;
  BVar10 = FunctionModule::pushBackBB(local_230);
  BuilderContext::setCurBasicBlock(pBVar3,BVar10);
  if (cVar14 == '#') {
    local_170[0] = local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"this","");
    makeReg((Builder *)&local_228,(string *)this);
    if (local_170[0] != local_160) {
      operator_delete(local_170[0],local_160[0] + 1);
    }
    pBVar3 = this->ctx;
    BVar10._M_node =
         (local_230->bbs).
         super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Alloca,std::allocator<mocker::ir::Alloca>,std::shared_ptr<mocker::ir::Reg>&>
              (&local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Alloca **)&local_258,(allocator<mocker::ir::Alloca> *)&local_240,
               &local_228);
    local_130.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_130.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInstFront(pBVar3,BVar10,&local_130);
    if (local_130.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pBVar3 = this->ctx;
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"0","");
    makeReg((Builder *)&local_258,(string *)this);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>>
              (pBVar3,&local_228,&local_258);
    if (local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_190[0] != local_180) {
      operator_delete(local_190[0],local_180[0] + 1);
    }
    if (local_228.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_228.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  psVar11 = (local_248->formalParameters).
            super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_248->formalParameters).
      super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar11) {
    local_1a8 = (ulong)(cVar14 == '#');
    uVar15 = 0;
    do {
      peVar1 = ((psVar11[uVar15].
                 super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               identifier).super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pcVar4 = (peVar1->val)._M_dataplus._M_p;
      local_228.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_218;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,pcVar4,pcVar4 + (peVar1->val)._M_string_length);
      local_1c8[0] = local_1b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,
                 local_228.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (undefined1 *)
                 ((long)&(local_228.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base +
                 (long)local_228.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr));
      makeReg((Builder *)&local_258,(string *)this);
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      pBVar3 = this->ctx;
      BVar10._M_node =
           (local_230->bbs).
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl
           ._M_node.super__List_node_base._M_next;
      local_240.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::Alloca,std::allocator<mocker::ir::Alloca>,std::shared_ptr<mocker::ir::Reg>&>
                (&local_240.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(Alloca **)&local_240,(allocator<mocker::ir::Alloca> *)&local_259,
                 &local_258);
      local_1a0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_240.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1a0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = local_240.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
      local_240.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_240.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      BuilderContext::appendInstFront(pBVar3,BVar10,&local_1a0);
      if (local_1a0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_240.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_240.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pBVar3 = this->ctx;
      __val = uVar15 + local_1a8;
      cVar14 = '\x01';
      if (9 < __val) {
        uVar13 = __val;
        cVar8 = '\x04';
        do {
          cVar14 = cVar8;
          if (uVar13 < 100) {
            cVar14 = cVar14 + -2;
            goto LAB_00143030;
          }
          if (uVar13 < 1000) {
            cVar14 = cVar14 + -1;
            goto LAB_00143030;
          }
          if (uVar13 < 10000) goto LAB_00143030;
          bVar9 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          cVar8 = cVar14 + '\x04';
        } while (bVar9);
        cVar14 = cVar14 + '\x01';
      }
LAB_00143030:
      local_1e8 = local_1d8;
      std::__cxx11::string::_M_construct((ulong)&local_1e8,cVar14);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1e8,local_1e0,__val);
      makeReg((Builder *)&local_240,(string *)this);
      BuilderContext::
      emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>>
                (pBVar3,&local_258,&local_240);
      if (local_240.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_240.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,local_1d8[0] + 1);
      }
      if (local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_228.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_218) {
        operator_delete(local_228.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_218._0_8_ + 1);
      }
      uVar15 = uVar15 + 1;
      psVar11 = (local_248->formalParameters).
                super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(local_248->formalParameters).
                                    super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar11 >> 4)
            );
  }
  peVar5 = (local_248->body).
           super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar6 = (peVar5->stmts).
           super__Vector_base<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar16 = (peVar5->stmts).
                 super__Vector_base<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar16 != psVar6; psVar16 = psVar16 + 1
      ) {
    BVar10 = BuilderContext::getCurBasicBlock(this->ctx);
    bVar9 = BasicBlock::isCompleted((BasicBlock *)(BVar10._M_node + 1));
    if (bVar9) goto LAB_00143177;
    peVar7 = (psVar16->super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*(peVar7->super_ASTNode)._vptr_ASTNode[3])
              (peVar7,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
    if (bVar9) goto LAB_00143177;
  }
  BVar10 = BuilderContext::getCurBasicBlock(this->ctx);
  bVar9 = BasicBlock::isCompleted((BasicBlock *)(BVar10._M_node + 1));
  if (!bVar9) {
    BuilderContext::emplaceInst<mocker::ir::Ret>(this->ctx);
  }
LAB_00143177:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_208);
  return;
}

Assistant:

void Builder::operator()(const ast::FuncDecl &node) const {
  bool isMember = node.identifier->val.at(0) == '#';
  std::vector<std::string> paramIdent;
  if (isMember)
    paramIdent.emplace_back("this");
  for (auto &param : node.formalParameters)
    paramIdent.emplace_back(param->identifier->val);

  auto &func =
      ctx.addFunc(FunctionModule(node.identifier->val, std::move(paramIdent)));
  ctx.initFuncCtx(node.formalParameters.size());
  ctx.setCurBasicBlock(func.pushBackBB());

  if (isMember) {
    auto reg = makeReg("this");
    ctx.appendInstFront(func.getFirstBB(), std::make_shared<Alloca>(reg));
    ctx.emplaceInst<Store>(reg, makeReg("0"));
  }
  for (std::size_t i = 0; i < node.formalParameters.size(); ++i) {
    auto name = node.formalParameters[i]->identifier->val;
    auto reg = makeReg(name);
    ctx.appendInstFront(func.getFirstBB(), std::make_shared<Alloca>(reg));
    ctx.emplaceInst<Store>(reg, makeReg(std::to_string(i + isMember)));
  }

  for (auto &p : node.body->stmts) {
    if (ctx.getCurBasicBlock()->isCompleted())
      return;
    visit(*p);
  }
  if (!ctx.getCurBasicBlock()->isCompleted())
    ctx.emplaceInst<Ret>();
}